

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O3

void body(LexState *ls,expdesc *e,int ismethod,int line)

{
  byte bVar1;
  FuncState *pFVar2;
  lua_State *L_00;
  Proto *pPVar3;
  Dyndata *pDVar4;
  int iVar5;
  Proto **ppPVar6;
  TString *pTVar7;
  long lVar8;
  FuncState *fs;
  int iVar9;
  lua_State *L;
  BlockCnt bl;
  BlockCnt local_88;
  FuncState local_70;
  
  pFVar2 = ls->fs;
  L_00 = ls->L;
  pPVar3 = pFVar2->f;
  iVar9 = pPVar3->sizep;
  lVar8 = (long)iVar9;
  if (iVar9 <= pFVar2->np) {
    ppPVar6 = (Proto **)luaM_growaux_(L_00,pPVar3->p,&pPVar3->sizep,8,0x3ffff,"functions");
    pPVar3->p = ppPVar6;
    iVar5 = pPVar3->sizep;
    if (iVar9 < iVar5) {
      do {
        pPVar3->p[lVar8] = (Proto *)0x0;
        lVar8 = lVar8 + 1;
      } while (iVar5 != lVar8);
    }
  }
  local_70.f = luaF_newproto(L_00);
  ppPVar6 = pPVar3->p;
  iVar9 = pFVar2->np;
  pFVar2->np = iVar9 + 1;
  ppPVar6[iVar9] = local_70.f;
  if (((pPVar3->marked & 4) != 0) && (((local_70.f)->marked & 3) != 0)) {
    luaC_barrier_(L_00,(GCObject *)pPVar3,(GCObject *)local_70.f);
  }
  (local_70.f)->linedefined = line;
  local_70.prev = ls->fs;
  ls->fs = &local_70;
  local_70.pc = 0;
  local_70.lasttarget = 0;
  local_70.jpc = -1;
  local_70.nk = 0;
  iVar9 = 0;
  local_70.np = 0;
  local_70.nlocvars = 0;
  local_70.nactvar = '\0';
  local_70.nups = '\0';
  local_70.freereg = '\0';
  pDVar4 = ls->dyd;
  local_70.firstlocal = (pDVar4->actvar).n;
  (local_70.f)->source = ls->source;
  (local_70.f)->maxstacksize = '\x02';
  local_70.bl = &local_88;
  local_88.isloop = '\0';
  local_88.nactvar = '\0';
  local_88.firstlabel = (pDVar4->label).n;
  local_88.firstgoto = (pDVar4->gt).n;
  local_88.upval = '\0';
  local_88.previous = (BlockCnt *)0x0;
  local_70.ls = ls;
  checknext(ls,0x28);
  if (ismethod != 0) {
    pTVar7 = luaX_newstring(ls,"self",4);
    new_localvar(ls,pTVar7);
    adjustlocalvars((LexState *)ls->fs,1);
  }
  pFVar2 = ls->fs;
  pPVar3 = pFVar2->f;
  pPVar3->is_vararg = '\0';
  iVar5 = (ls->t).token;
  if (iVar5 != 0x29) {
    iVar9 = 0;
    while (iVar5 == 0x124) {
      pTVar7 = str_checkname(ls);
      new_localvar(ls,pTVar7);
      if ((pPVar3->is_vararg != '\0') || ((ls->t).token != 0x2c)) {
        iVar9 = iVar9 + 1;
        goto LAB_0011b79d;
      }
      luaX_next(ls);
      iVar9 = iVar9 + 1;
      iVar5 = (ls->t).token;
    }
    if (iVar5 != 0x119) {
      luaX_syntaxerror(ls,"<name> or \'...\' expected");
    }
    luaX_next(ls);
    pPVar3->is_vararg = '\x01';
  }
LAB_0011b79d:
  adjustlocalvars((LexState *)ls->fs,iVar9);
  bVar1 = pFVar2->nactvar;
  pPVar3->numparams = bVar1;
  luaK_reserveregs(pFVar2,(uint)bVar1);
  checknext(ls,0x29);
  statlist(ls);
  (local_70.f)->lastlinedefined = ls->linenumber;
  check_match(ls,0x106,0x109,line);
  pFVar2 = ls->fs->prev;
  iVar9 = luaK_codeABx(pFVar2,OP_CLOSURE,0,pFVar2->np - 1);
  e->t = -1;
  e->f = -1;
  e->k = VRELOCABLE;
  (e->u).info = iVar9;
  luaK_exp2nextreg(pFVar2,e);
  close_func(ls);
  return;
}

Assistant:

static void body (LexState *ls, expdesc *e, int ismethod, int line) {
  /* body ->  '(' parlist ')' block END */
  FuncState new_fs;
  BlockCnt bl;
  new_fs.f = addprototype(ls);
  new_fs.f->linedefined = line;
  open_func(ls, &new_fs, &bl);
  checknext(ls, '(');
  if (ismethod) {
    new_localvarliteral(ls, "self");  /* create 'self' parameter */
    adjustlocalvars(ls, 1);
  }
  parlist(ls);
  checknext(ls, ')');
  statlist(ls);
  new_fs.f->lastlinedefined = ls->linenumber;
  check_match(ls, TK_END, TK_FUNCTION, line);
  codeclosure(ls, e);
  close_func(ls);
}